

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O0

string * __thiscall
BamTools::Internal::HttpRequestHeader::ToString_abi_cxx11_(HttpRequestHeader *this)

{
  int iVar1;
  ostream *poVar2;
  HttpHeader *in_RSI;
  string *in_RDI;
  stringstream request;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [16];
  HttpHeader *in_stack_fffffffffffffe88;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,(string *)(in_RSI + 1));
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = std::operator<<(poVar2,(string *)
                                  &in_RSI[1].m_fields._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_left);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = std::operator<<(poVar2,(string *)Constants::HTTP_STRING_abi_cxx11_);
  iVar1 = HttpHeader::GetMajorVersion(in_RSI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,'.');
  iVar1 = HttpHeader::GetMinorVersion(in_RSI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,(string *)Constants::FIELD_NEWLINE_abi_cxx11_);
  HttpHeader::ToString_abi_cxx11_(in_stack_fffffffffffffe88);
  poVar2 = std::operator<<(poVar2,local_1c8);
  std::operator<<(poVar2,(string *)Constants::FIELD_NEWLINE_abi_cxx11_);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string HttpRequestHeader::ToString() const
{
    std::stringstream request;
    request << m_method << Constants::SPACE_CHAR << m_resource << Constants::SPACE_CHAR
            << Constants::HTTP_STRING << GetMajorVersion() << Constants::DOT_CHAR
            << GetMinorVersion() << Constants::FIELD_NEWLINE << HttpHeader::ToString()
            << Constants::FIELD_NEWLINE;
    return request.str();
}